

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

int SUNMatMatvec_Band(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  int iVar3;
  realtype *prVar4;
  realtype *prVar5;
  long local_70;
  long local_68;
  realtype *yd;
  realtype *xd;
  realtype *col_j;
  sunindextype ie;
  sunindextype is;
  sunindextype j;
  sunindextype i;
  N_Vector y_local;
  N_Vector x_local;
  SUNMatrix A_local;
  
  iVar3 = SMCompatible2_Band(A,x,y);
  if (iVar3 == 0) {
    A_local._4_4_ = 1;
  }
  else {
    prVar4 = N_VGetArrayPointer(x);
    prVar5 = N_VGetArrayPointer(y);
    if (((prVar4 == (realtype *)0x0) || (prVar5 == (realtype *)0x0)) || (prVar4 == prVar5)) {
      A_local._4_4_ = 1;
    }
    else {
      for (j = 0; j < *A->content; j = j + 1) {
        prVar5[j] = 0.0;
      }
      for (is = 0; is < *(long *)((long)A->content + 8); is = is + 1) {
        lVar1 = *(long *)(*(long *)((long)A->content + 0x40) + is * 8);
        lVar2 = *(long *)((long)A->content + 0x28);
        if (is - *(long *)((long)A->content + 0x18) < 0) {
          local_68 = 0;
        }
        else {
          local_68 = is - *(long *)((long)A->content + 0x18);
        }
        if (*A->content + -1 < is + *(long *)((long)A->content + 0x20)) {
          local_70 = *A->content + -1;
        }
        else {
          local_70 = is + *(long *)((long)A->content + 0x20);
        }
        for (j = local_68; j <= local_70; j = j + 1) {
          prVar5[j] = *(double *)(lVar1 + lVar2 * 8 + (j - is) * 8) * prVar4[is] + prVar5[j];
        }
      }
      A_local._4_4_ = 0;
    }
  }
  return A_local._4_4_;
}

Assistant:

int SUNMatMatvec_Band(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j, is, ie;
  realtype *col_j, *xd, *yd;
  
  /* Verify that A, x and y are compatible */
  if (!SMCompatible2_Band(A, x, y))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return 1;

  /* Perform operation */
  for (i=0; i<SM_ROWS_B(A); i++)
    yd[i] = ZERO;
  for(j=0; j<SM_COLUMNS_B(A); j++) {
    col_j = SM_COLUMN_B(A,j);
    is = SUNMAX(0, j-SM_UBAND_B(A));
    ie = SUNMIN(SM_ROWS_B(A)-1, j+SM_LBAND_B(A));
    for (i=is; i<=ie; i++)
      yd[i] += col_j[i-j]*xd[j];
  }
  return 0;
}